

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamWriter::writeTextElement
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView text)

{
  long lVar1;
  QAnyStringView text_00;
  QAnyStringView name_00;
  QAnyStringView namespaceUri_00;
  size_t in_RCX;
  size_t in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_R8;
  long in_FS_OFFSET;
  size_t in_stack_00000008;
  QXmlStreamWriter *in_stack_00000048;
  QXmlStreamWriter *in_stack_ffffffffffffff88;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  namespaceUri_00.m_size = in_RSI;
  namespaceUri_00.field_0.m_data = in_R8.m_data;
  name_00.m_size = in_RCX;
  name_00.field_0.m_data = in_stack_ffffffffffffffb0.m_data;
  writeStartElement(in_stack_ffffffffffffff88,namespaceUri_00,name_00);
  text_00.m_size = in_stack_00000008;
  text_00.field_0.m_data = in_RDI.m_data;
  writeCharacters(in_stack_ffffffffffffff88,text_00);
  writeEndElement(in_stack_00000048);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeTextElement(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView text)
{
    writeStartElement(namespaceUri, name);
    writeCharacters(text);
    writeEndElement();
}